

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubD::HasSharpEdges(ON_SubD *this)

{
  uint uVar1;
  
  uVar1 = AggregateEdgeAttributes(this);
  return SUB41((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

bool ON_SubD::HasSharpEdges() const
{
  bool bHasSharpEdges = 0 != (ON_ComponentAttributes::EdgeAttributes::InteriorSharp & this->AggregateEdgeAttributes());
  return bHasSharpEdges;

  //ON_SubDEdgeIterator eit = this->EdgeIterator();
  //for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
  //{
  //  if (e->IsSharp())
  //    return true;
  //}
  //return false;
}